

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DOMNodeIteratorImpl::acceptNode(DOMNodeIteratorImpl *this,DOMNode *node)

{
  ulong uVar1;
  int iVar2;
  DOMException *this_00;
  bool local_69;
  MemoryManager *local_60;
  DOMDocumentImpl *local_50;
  DOMNode *node_local;
  DOMNodeIteratorImpl *this_local;
  
  if ((this->fDetached & 1U) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      local_60 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      if (this->fDocument == (DOMDocument *)0x0) {
        local_50 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_50 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
      }
      local_60 = DOMDocumentImpl::getMemoryManager(local_50);
    }
    DOMException::DOMException(this_00,0xb,0,local_60);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (this->fNodeFilter == (DOMNodeFilter *)0x0) {
    uVar1 = this->fWhatToShow;
    iVar2 = (*node->_vptr_DOMNode[4])();
    this_local._7_1_ = (uVar1 & (long)(1 << ((char)iVar2 - 1U & 0x1f))) != 0;
  }
  else {
    uVar1 = this->fWhatToShow;
    iVar2 = (*node->_vptr_DOMNode[4])();
    local_69 = false;
    if ((uVar1 & (long)(1 << ((char)iVar2 - 1U & 0x1f))) != 0) {
      iVar2 = (**(code **)(*(long *)this->fNodeFilter + 0x10))(this->fNodeFilter,node);
      local_69 = iVar2 == 1;
    }
    this_local._7_1_ = local_69;
  }
  return this_local._7_1_;
}

Assistant:

bool DOMNodeIteratorImpl::acceptNode (DOMNode* node) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    if (fNodeFilter == 0) {
        return ((fWhatToShow & (1 << (node->getNodeType() - 1))) != 0);
    } else {
        return ((fWhatToShow & (1 << (node->getNodeType() - 1))) != 0)
            && fNodeFilter->acceptNode(node) == DOMNodeFilter::FILTER_ACCEPT;
    }
}